

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_decompress.c
# Opt level: O0

libdeflate_result
libdeflate_gzip_decompress_ex
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  byte bVar1;
  uint32_t uVar2;
  libdeflate_decompressor *d_00;
  uint32_t *puVar3;
  libdeflate_decompressor *plVar4;
  ulong in_RDX;
  char *in_RSI;
  uint32_t in_R8D;
  size_t *in_R9;
  bool bVar5;
  u16 xlen;
  size_t *in_stack_00000008;
  libdeflate_result result;
  size_t actual_out_nbytes;
  size_t actual_in_nbytes;
  u8 flg;
  u8 *in_end;
  u8 *in_next;
  u16 v;
  u32 v_1;
  u32 v_2;
  size_t *buffer;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  ushort in_stack_ffffffffffffff52;
  undefined4 in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  libdeflate_decompressor *local_88;
  libdeflate_result local_4c;
  
  d_00 = (libdeflate_decompressor *)(in_RSI + in_RDX);
  if (in_RDX < 0x12) {
    local_4c = LIBDEFLATE_BAD_DATA;
  }
  else if (*in_RSI == '\x1f') {
    if (in_RSI[1] == -0x75) {
      if (in_RSI[2] == '\b') {
        bVar1 = in_RSI[3];
        local_88 = (libdeflate_decompressor *)(in_RSI + 10);
        if ((bVar1 & 0xe0) == 0) {
          if ((bVar1 & 4) != 0) {
            in_stack_ffffffffffffff52 = *(ushort *)&local_88->u;
            if ((long)d_00 - (long)(in_RSI + 0xc) < (long)(ulong)(in_stack_ffffffffffffff52 + 8)) {
              return LIBDEFLATE_BAD_DATA;
            }
            local_88 = (libdeflate_decompressor *)
                       (in_RSI + 0xc + (int)(uint)in_stack_ffffffffffffff52);
          }
          if ((bVar1 & 8) != 0) {
            do {
              plVar4 = (libdeflate_decompressor *)((long)&local_88->u + 1);
              bVar5 = (local_88->u).precode_lens[0] != '\0';
              in_stack_ffffffffffffff51 = bVar5 && plVar4 != d_00;
              local_88 = plVar4;
            } while (bVar5 && plVar4 != d_00);
            if ((long)d_00 - (long)plVar4 < 8) {
              return LIBDEFLATE_BAD_DATA;
            }
          }
          if ((bVar1 & 0x10) != 0) {
            do {
              plVar4 = (libdeflate_decompressor *)((long)&local_88->u + 1);
              bVar5 = (local_88->u).precode_lens[0] != '\0';
              in_stack_ffffffffffffff50 = bVar5 && plVar4 != d_00;
              local_88 = plVar4;
            } while (bVar5 && plVar4 != d_00);
            if ((long)d_00 - (long)plVar4 < 8) {
              return LIBDEFLATE_BAD_DATA;
            }
          }
          if (((bVar1 & 2) == 0) ||
             (local_88 = (libdeflate_decompressor *)((long)&local_88->u + 2),
             7 < (long)d_00 - (long)local_88)) {
            buffer = in_stack_00000008;
            local_4c = libdeflate_deflate_decompress_ex
                                 (d_00,(void *)CONCAT17(bVar1,in_stack_ffffffffffffff68),
                                  in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                  CONCAT44(in_stack_ffffffffffffff54,
                                           CONCAT22(in_stack_ffffffffffffff52,
                                                    CONCAT11(in_stack_ffffffffffffff51,
                                                             in_stack_ffffffffffffff50))),
                                  in_stack_00000008,in_R9);
            if (local_4c == LIBDEFLATE_SUCCESS) {
              if (in_stack_00000008 != (size_t *)0x0) {
                in_R8D = (uint32_t)*in_stack_00000008;
              }
              puVar3 = (uint32_t *)((local_88->u).precode_lens + in_stack_ffffffffffffff60);
              uVar2 = libdeflate_crc32(CONCAT22(in_stack_ffffffffffffff52,
                                                CONCAT11(in_stack_ffffffffffffff51,
                                                         in_stack_ffffffffffffff50)),buffer,0xad8e41
                                      );
              if (uVar2 == *puVar3) {
                if (in_R8D == puVar3[1]) {
                  if (in_R9 != (size_t *)0x0) {
                    *in_R9 = (size_t)((long)puVar3 + (8 - (long)in_RSI));
                  }
                  local_4c = LIBDEFLATE_SUCCESS;
                }
                else {
                  local_4c = LIBDEFLATE_BAD_DATA;
                }
              }
              else {
                local_4c = LIBDEFLATE_BAD_DATA;
              }
            }
          }
          else {
            local_4c = LIBDEFLATE_BAD_DATA;
          }
        }
        else {
          local_4c = LIBDEFLATE_BAD_DATA;
        }
      }
      else {
        local_4c = LIBDEFLATE_BAD_DATA;
      }
    }
    else {
      local_4c = LIBDEFLATE_BAD_DATA;
    }
  }
  else {
    local_4c = LIBDEFLATE_BAD_DATA;
  }
  return local_4c;
}

Assistant:

libdeflate_result LIBDEFLATEAPI
libdeflate_gzip_decompress_ex(struct libdeflate_decompressor *d,
			      const void *in, size_t in_nbytes,
			      void *out, size_t out_nbytes_avail,
			      size_t *actual_in_nbytes_ret,
			      size_t *actual_out_nbytes_ret)
{
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	u8 flg;
	size_t actual_in_nbytes;
	size_t actual_out_nbytes;
	enum libdeflate_result result;

	if (in_nbytes < GZIP_MIN_OVERHEAD)
		return LIBDEFLATE_BAD_DATA;

	/* ID1 */
	if (*in_next++ != GZIP_ID1)
		return LIBDEFLATE_BAD_DATA;
	/* ID2 */
	if (*in_next++ != GZIP_ID2)
		return LIBDEFLATE_BAD_DATA;
	/* CM */
	if (*in_next++ != GZIP_CM_DEFLATE)
		return LIBDEFLATE_BAD_DATA;
	flg = *in_next++;
	/* MTIME */
	in_next += 4;
	/* XFL */
	in_next += 1;
	/* OS */
	in_next += 1;

	if (flg & GZIP_FRESERVED)
		return LIBDEFLATE_BAD_DATA;

	/* Extra field */
	if (flg & GZIP_FEXTRA) {
		u16 xlen = get_unaligned_le16(in_next);
		in_next += 2;

		if (in_end - in_next < (u32)xlen + GZIP_FOOTER_SIZE)
			return LIBDEFLATE_BAD_DATA;

		in_next += xlen;
	}

	/* Original file name (zero terminated) */
	if (flg & GZIP_FNAME) {
		while (*in_next++ != 0 && in_next != in_end)
			;
		if (in_end - in_next < GZIP_FOOTER_SIZE)
			return LIBDEFLATE_BAD_DATA;
	}

	/* File comment (zero terminated) */
	if (flg & GZIP_FCOMMENT) {
		while (*in_next++ != 0 && in_next != in_end)
			;
		if (in_end - in_next < GZIP_FOOTER_SIZE)
			return LIBDEFLATE_BAD_DATA;
	}

	/* CRC16 for gzip header */
	if (flg & GZIP_FHCRC) {
		in_next += 2;
		if (in_end - in_next < GZIP_FOOTER_SIZE)
			return LIBDEFLATE_BAD_DATA;
	}

	/* Compressed data  */
	result = libdeflate_deflate_decompress_ex(d, in_next,
					in_end - GZIP_FOOTER_SIZE - in_next,
					out, out_nbytes_avail,
					&actual_in_nbytes,
					actual_out_nbytes_ret);
	if (result != LIBDEFLATE_SUCCESS)
		return result;

	if (actual_out_nbytes_ret)
		actual_out_nbytes = *actual_out_nbytes_ret;
	else
		actual_out_nbytes = out_nbytes_avail;

	in_next += actual_in_nbytes;

	/* CRC32 */
	if (libdeflate_crc32(0, out, actual_out_nbytes) !=
	    get_unaligned_le32(in_next))
		return LIBDEFLATE_BAD_DATA;
	in_next += 4;

	/* ISIZE */
	if ((u32)actual_out_nbytes != get_unaligned_le32(in_next))
		return LIBDEFLATE_BAD_DATA;
	in_next += 4;

	if (actual_in_nbytes_ret)
		*actual_in_nbytes_ret = in_next - (u8 *)in;

	return LIBDEFLATE_SUCCESS;
}